

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGXMLScanner.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::SGXMLScanner::scanRawAttrListforNameSpaces(SGXMLScanner *this,XMLSize_t attCount)

{
  XMLBuffer *this_00;
  XMLBufferMgr *this_01;
  XMLValidator *pXVar1;
  SchemaValidator *pSVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  KVStringPair *pKVar6;
  XMLBuffer *pXVar7;
  DatatypeValidator *pDVar8;
  undefined1 uVar9;
  XMLSize_t XVar10;
  XMLCh *pXVar11;
  XMLSize_t index_1;
  XMLSize_t index;
  XMLSize_t XVar12;
  XMLCh *pXVar13;
  int colonPos;
  XMLSize_t local_60;
  XMLBufBid bbXsi;
  
  local_60 = attCount;
  for (XVar12 = 0; local_60 != XVar12; XVar12 = XVar12 + 1) {
    pKVar6 = BaseRefVectorOf<xercesc_4_0::KVStringPair>::elementAt
                       (&this->fRawAttrList->super_BaseRefVectorOf<xercesc_4_0::KVStringPair>,XVar12
                       );
    pXVar13 = pKVar6->fKey;
    iVar4 = XMLString::compareNString(pXVar13,(XMLCh *)XMLUni::fgXMLNSColonString,6);
    if (iVar4 == 0) {
LAB_002b5818:
      pXVar11 = pKVar6->fValue;
      updateNSMap(this,pXVar13,pXVar11,this->fRawAttrColonList[XVar12]);
      bVar3 = XMLString::equals(pXVar11,(XMLCh *)SchemaSymbols::fgURI_XSI);
      if (bVar3) {
        this->fSeeXsi = true;
      }
    }
    else {
      bVar3 = XMLString::equals(pXVar13,(XMLCh *)XMLUni::fgXMLNSString);
      if (bVar3) goto LAB_002b5818;
    }
  }
  if (this->fSeeXsi == true) {
    this_00 = &(this->super_XMLScanner).fURIBuf;
    for (XVar12 = 0; local_60 != XVar12; XVar12 = XVar12 + 1) {
      pKVar6 = BaseRefVectorOf<xercesc_4_0::KVStringPair>::elementAt
                         (&this->fRawAttrList->super_BaseRefVectorOf<xercesc_4_0::KVStringPair>,
                          XVar12);
      pXVar13 = pKVar6->fKey;
      XVar10 = (XMLSize_t)this->fRawAttrColonList[XVar12];
      pXVar11 = L"";
      if (XVar10 != 0xffffffffffffffff) {
        XMLBuffer::set(this_00,pXVar13,XVar10);
        pXVar11 = (this->super_XMLScanner).fURIBuf.fBuffer;
        pXVar11[(this->super_XMLScanner).fURIBuf.fIndex] = L'\0';
      }
      uVar5 = XMLScanner::resolvePrefix(&this->super_XMLScanner,pXVar11,Mode_Attribute);
      if (uVar5 == (this->super_XMLScanner).fSchemaNamespaceId) {
        pXVar11 = pKVar6->fValue;
        pXVar13 = pXVar13 + XVar10 + 1;
        bVar3 = XMLString::equals(pXVar13,(XMLCh *)SchemaSymbols::fgXSI_SCHEMALOCATION);
        if (bVar3) {
          parseSchemaLocation(this,pXVar11,false);
        }
        else {
          bVar3 = XMLString::equals(pXVar13,(XMLCh *)SchemaSymbols::fgXSI_NONAMESPACESCHEMALOCATION)
          ;
          if (bVar3) {
            resolveSchemaGrammar(this,pXVar11,L"",false);
          }
        }
      }
    }
    pXVar1 = (this->super_XMLScanner).fValidator;
    if (pXVar1 != (XMLValidator *)0x0) {
      iVar4 = (*pXVar1->_vptr_XMLValidator[0xd])();
      if ((char)iVar4 != '\0') {
        this_01 = &(this->super_XMLScanner).fBufMgr;
        for (XVar12 = 0; local_60 != XVar12; XVar12 = XVar12 + 1) {
          pKVar6 = BaseRefVectorOf<xercesc_4_0::KVStringPair>::elementAt
                             (&this->fRawAttrList->super_BaseRefVectorOf<xercesc_4_0::KVStringPair>,
                              XVar12);
          pXVar13 = pKVar6->fKey;
          XVar10 = (XMLSize_t)this->fRawAttrColonList[XVar12];
          pXVar11 = L"";
          if (XVar10 != 0xffffffffffffffff) {
            XMLBuffer::set(this_00,pXVar13,XVar10);
            pXVar11 = (this->super_XMLScanner).fURIBuf.fBuffer;
            pXVar11[(this->super_XMLScanner).fURIBuf.fIndex] = L'\0';
          }
          uVar5 = XMLScanner::resolvePrefix(&this->super_XMLScanner,pXVar11,Mode_Attribute);
          if (uVar5 == (this->super_XMLScanner).fSchemaNamespaceId) {
            pXVar11 = pKVar6->fValue;
            pXVar13 = pXVar13 + XVar10 + 1;
            bVar3 = XMLString::equals(pXVar13,(XMLCh *)SchemaSymbols::fgXSI_TYPE);
            if (bVar3) {
              pXVar7 = XMLBufferMgr::bidOnBuffer(this_01);
              bbXsi.fBuffer = pXVar7;
              bbXsi.fMgr = this_01;
              pDVar8 = RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::
                       get(DatatypeValidatorFactory::fBuiltInRegistry,SchemaSymbols::fgDT_QNAME);
              normalizeAttRawValue(this,(XMLCh *)SchemaSymbols::fgXSI_TYPE,pXVar11,pXVar7);
              pSVar2 = (SchemaValidator *)(this->super_XMLScanner).fValidator;
              pXVar13 = pXVar7->fBuffer;
              pXVar13[pXVar7->fIndex] = L'\0';
              SchemaValidator::normalizeWhiteSpace(pSVar2,pDVar8,pXVar13,pXVar7,true);
              if (pXVar7->fIndex != 0) {
                colonPos = -1;
                pXVar13 = pXVar7->fBuffer;
                pXVar13[pXVar7->fIndex] = L'\0';
                uVar5 = XMLScanner::resolveQName
                                  (&this->super_XMLScanner,pXVar13,
                                   &(this->super_XMLScanner).fPrefixBuf,Mode_Element,&colonPos);
                pXVar13 = (this->super_XMLScanner).fPrefixBuf.fBuffer;
                pSVar2 = (SchemaValidator *)(this->super_XMLScanner).fValidator;
                pXVar13[(this->super_XMLScanner).fPrefixBuf.fIndex] = L'\0';
                pXVar11 = pXVar7->fBuffer;
                pXVar11[pXVar7->fIndex] = L'\0';
                SchemaValidator::setXsiType(pSVar2,pXVar13,pXVar11 + (long)colonPos + 1,uVar5);
              }
            }
            else {
              bVar3 = XMLString::equals(pXVar13,L"nil");
              if (!bVar3) goto LAB_002b5be2;
              pXVar7 = XMLBufferMgr::bidOnBuffer(this_01);
              bbXsi.fBuffer = pXVar7;
              bbXsi.fMgr = this_01;
              pDVar8 = RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::
                       get(DatatypeValidatorFactory::fBuiltInRegistry,SchemaSymbols::fgDT_BOOLEAN);
              normalizeAttRawValue(this,L"nil",pXVar11,pXVar7);
              pSVar2 = (SchemaValidator *)(this->super_XMLScanner).fValidator;
              pXVar13 = pXVar7->fBuffer;
              pXVar13[pXVar7->fIndex] = L'\0';
              SchemaValidator::normalizeWhiteSpace(pSVar2,pDVar8,pXVar13,pXVar7,true);
              pXVar13 = pXVar7->fBuffer;
              pXVar13[pXVar7->fIndex] = L'\0';
              bVar3 = XMLString::equals(pXVar13,(XMLCh *)SchemaSymbols::fgATTVAL_TRUE);
              uVar9 = 1;
              if (!bVar3) {
                pXVar13 = pXVar7->fBuffer;
                pXVar13[pXVar7->fIndex] = L'\0';
                bVar3 = XMLString::equals(pXVar13,(XMLCh *)SchemaSymbols::fgATTVAL_FALSE);
                if (!bVar3) {
                  pXVar13 = pXVar7->fBuffer;
                  pXVar13[pXVar7->fIndex] = L'\0';
                  XMLScanner::emitError
                            (&this->super_XMLScanner,InvalidAttValue,pXVar13,pXVar11,(XMLCh *)0x0,
                             (XMLCh *)0x0);
                  goto LAB_002b5bd8;
                }
                uVar9 = 0;
              }
              pXVar1 = (this->super_XMLScanner).fValidator;
              *(undefined1 *)&pXVar1[1].fScanner = uVar9;
              *(undefined1 *)((long)&pXVar1[1].fScanner + 1) = 1;
            }
LAB_002b5bd8:
            XMLBufBid::~XMLBufBid(&bbXsi);
          }
LAB_002b5be2:
        }
      }
    }
  }
  return;
}

Assistant:

void SGXMLScanner::scanRawAttrListforNameSpaces(XMLSize_t attCount)
{
    //  Make an initial pass through the list and find any xmlns attributes or
    //  schema attributes.
    //  When we find one, send it off to be used to update the element stack's
    //  namespace mappings.
    for (XMLSize_t index = 0; index < attCount; index++)
    {
        // each attribute has the prefix:suffix="value"
        const KVStringPair* curPair = fRawAttrList->elementAt(index);
        const XMLCh* rawPtr = curPair->getKey();

        //  If either the key begins with "xmlns:" or its just plain
        //  "xmlns", then use it to update the map.
        if (!XMLString::compareNString(rawPtr, XMLUni::fgXMLNSColonString, 6)
        ||  XMLString::equals(rawPtr, XMLUni::fgXMLNSString))
        {
            const XMLCh* valuePtr = curPair->getValue();

            updateNSMap(rawPtr, valuePtr, fRawAttrColonList[index]);

            // if the schema URI is seen in the the valuePtr, set the boolean seeXsi
            if (XMLString::equals(valuePtr, SchemaSymbols::fgURI_XSI)) {
                fSeeXsi = true;
            }
        }
    }

    // walk through the list again to deal with "xsi:...."
    if (fSeeXsi)
    {
        for (XMLSize_t index = 0; index < attCount; index++)
        {
            // each attribute has the prefix:suffix="value"
            const KVStringPair* curPair = fRawAttrList->elementAt(index);
            const XMLCh* rawPtr = curPair->getKey();
            const XMLCh* prefPtr;

            int   colonInd = fRawAttrColonList[index];

            if (colonInd != -1) {
                fURIBuf.set(rawPtr, colonInd);
                prefPtr = fURIBuf.getRawBuffer();
            }
            else {
                prefPtr = XMLUni::fgZeroLenString;
            }

            // if schema URI has been seen, scan for the schema location and uri
            // and resolve the schema grammar
            if (resolvePrefix(prefPtr, ElemStack::Mode_Attribute) == fSchemaNamespaceId) {

                const XMLCh* valuePtr = curPair->getValue();
                const XMLCh*  suffPtr = &rawPtr[colonInd + 1];

                if (XMLString::equals(suffPtr, SchemaSymbols::fgXSI_SCHEMALOCATION))
                    parseSchemaLocation(valuePtr);
                else if (XMLString::equals(suffPtr, SchemaSymbols::fgXSI_NONAMESPACESCHEMALOCATION))
                    resolveSchemaGrammar(valuePtr, XMLUni::fgZeroLenString);
            }
        }

        // do it another time, as xsi:type and xsi:nill only work if the schema grammar has been already
        // loaded (JIRA XERCESC-1937)
        if (fValidator && fValidator->handlesSchema())
        {
            for (XMLSize_t index = 0; index < attCount; index++)
            {
                // each attribute has the prefix:suffix="value"
                const KVStringPair* curPair = fRawAttrList->elementAt(index);
                const XMLCh* rawPtr = curPair->getKey();
                const XMLCh* prefPtr;

                int   colonInd = fRawAttrColonList[index];

                if (colonInd != -1) {
                    fURIBuf.set(rawPtr, colonInd);
                    prefPtr = fURIBuf.getRawBuffer();
                }
                else {
                    prefPtr = XMLUni::fgZeroLenString;
                }

                // scan for schema type
                if (resolvePrefix(prefPtr, ElemStack::Mode_Attribute) == fSchemaNamespaceId) {

                    const XMLCh* valuePtr = curPair->getValue();
                    const XMLCh*  suffPtr = &rawPtr[colonInd + 1];

                    if (XMLString::equals(suffPtr, SchemaSymbols::fgXSI_TYPE))
                    {
                        XMLBufBid bbXsi(&fBufMgr);
                        XMLBuffer& fXsiType = bbXsi.getBuffer();

                        // normalize the attribute according to schema whitespace facet
                        DatatypeValidator* tempDV = DatatypeValidatorFactory::getBuiltInRegistry()->get(SchemaSymbols::fgDT_QNAME);
                        normalizeAttRawValue(SchemaSymbols::fgXSI_TYPE, valuePtr, fXsiType);
                        ((SchemaValidator*) fValidator)->normalizeWhiteSpace(tempDV, fXsiType.getRawBuffer(), fXsiType, true);
                        if (!fXsiType.isEmpty()) {
                            int colonPos = -1;
                            unsigned int uriId = resolveQName (
                                  fXsiType.getRawBuffer()
                                , fPrefixBuf
                                , ElemStack::Mode_Element
                                , colonPos
                            );
                            ((SchemaValidator*)fValidator)->setXsiType(fPrefixBuf.getRawBuffer(), fXsiType.getRawBuffer() + colonPos + 1, uriId);
                        }
                    }
                    else if (XMLString::equals(suffPtr, SchemaSymbols::fgATT_NILL))
                    {
                        // normalize the attribute according to schema whitespace facet
                        XMLBufBid bbXsi(&fBufMgr);
                        XMLBuffer& fXsiNil = bbXsi.getBuffer();

                        DatatypeValidator* tempDV = DatatypeValidatorFactory::getBuiltInRegistry()->get(SchemaSymbols::fgDT_BOOLEAN);
                        normalizeAttRawValue(SchemaSymbols::fgATT_NILL, valuePtr, fXsiNil);
                        ((SchemaValidator*) fValidator)->normalizeWhiteSpace(tempDV, fXsiNil.getRawBuffer(), fXsiNil, true);
                        if(XMLString::equals(fXsiNil.getRawBuffer(), SchemaSymbols::fgATTVAL_TRUE))
                            ((SchemaValidator*)fValidator)->setNillable(true);
                        else if(XMLString::equals(fXsiNil.getRawBuffer(), SchemaSymbols::fgATTVAL_FALSE))
                            ((SchemaValidator*)fValidator)->setNillable(false);
                        else
                            emitError(XMLErrs::InvalidAttValue, fXsiNil.getRawBuffer(), valuePtr);
                    }
                }
            }
        }
    }
}